

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegExecCtxtPtr xmlRegNewExecCtxt(xmlRegexpPtr comp,xmlRegExecCallbacks callback,void *data)

{
  xmlRegExecCtxtPtr pxVar1;
  int *piVar2;
  
  if ((comp != (xmlRegexpPtr)0x0) &&
     (((comp->compact != (int *)0x0 || (comp->states != (xmlRegStatePtr *)0x0)) &&
      (pxVar1 = (xmlRegExecCtxtPtr)(*xmlMalloc)(0x98), pxVar1 != (xmlRegExecCtxtPtr)0x0)))) {
    memset(&pxVar1->callback,0,0x88);
    pxVar1->status = 0;
    pxVar1->determinist = 1;
    pxVar1->maxRollbacks = 0;
    pxVar1->nbRollbacks = 0;
    pxVar1->rollbacks = (xmlRegExecRollback *)0x0;
    pxVar1->comp = comp;
    if (comp->compact == (int *)0x0) {
      pxVar1->state = *comp->states;
    }
    pxVar1->transno = 0;
    pxVar1->transcount = 0;
    pxVar1->callback = callback;
    pxVar1->data = data;
    if ((long)comp->nbCounters < 1) {
      pxVar1->counts = (int *)0x0;
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)(*xmlMalloc)((long)comp->nbCounters << 3);
      pxVar1->counts = piVar2;
      if (piVar2 == (int *)0x0) {
        (*xmlFree)(pxVar1);
        return (xmlRegExecCtxtPtr)0x0;
      }
      memset(piVar2,0,(long)comp->nbCounters << 3);
      piVar2 = pxVar1->counts + comp->nbCounters;
    }
    pxVar1->errCounts = piVar2;
    pxVar1->inputStackMax = 0;
    pxVar1->inputStackNr = 0;
    pxVar1->inputStack = (xmlRegInputTokenPtr)0x0;
    pxVar1->errStateNo = -1;
    pxVar1->errString = (xmlChar *)0x0;
    pxVar1->nbPush = 0;
    return pxVar1;
  }
  return (xmlRegExecCtxtPtr)0x0;
}

Assistant:

xmlRegExecCtxtPtr
xmlRegNewExecCtxt(xmlRegexpPtr comp, xmlRegExecCallbacks callback, void *data) {
    xmlRegExecCtxtPtr exec;

    if (comp == NULL)
	return(NULL);
    if ((comp->compact == NULL) && (comp->states == NULL))
        return(NULL);
    exec = (xmlRegExecCtxtPtr) xmlMalloc(sizeof(xmlRegExecCtxt));
    if (exec == NULL)
	return(NULL);
    memset(exec, 0, sizeof(xmlRegExecCtxt));
    exec->inputString = NULL;
    exec->index = 0;
    exec->determinist = 1;
    exec->maxRollbacks = 0;
    exec->nbRollbacks = 0;
    exec->rollbacks = NULL;
    exec->status = XML_REGEXP_OK;
    exec->comp = comp;
    if (comp->compact == NULL)
	exec->state = comp->states[0];
    exec->transno = 0;
    exec->transcount = 0;
    exec->callback = callback;
    exec->data = data;
    if (comp->nbCounters > 0) {
        /*
	 * For error handling, exec->counts is allocated twice the size
	 * the second half is used to store the data in case of rollback
	 */
	exec->counts = (int *) xmlMalloc(comp->nbCounters * sizeof(int)
	                                 * 2);
	if (exec->counts == NULL) {
	    xmlFree(exec);
	    return(NULL);
	}
        memset(exec->counts, 0, comp->nbCounters * sizeof(int) * 2);
	exec->errCounts = &exec->counts[comp->nbCounters];
    } else {
	exec->counts = NULL;
	exec->errCounts = NULL;
    }
    exec->inputStackMax = 0;
    exec->inputStackNr = 0;
    exec->inputStack = NULL;
    exec->errStateNo = -1;
    exec->errString = NULL;
    exec->nbPush = 0;
    return(exec);
}